

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advertise_options.h
# Opt level: O2

void __thiscall
miniros::AdvertiseOptions::init<std_msgs::Empty_<std::allocator<void>>>
          (AdvertiseOptions *this,string *_topic,uint32_t _queue_size,
          SubscriberStatusCallback *_connect_cb,SubscriberStatusCallback *_disconnect_cb)

{
  std::__cxx11::string::_M_assign((string *)this);
  this->queue_size = _queue_size;
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::operator=
            (&this->connect_cb,_connect_cb);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::operator=
            (&this->disconnect_cb,_disconnect_cb);
  std::__cxx11::string::assign((char *)&this->md5sum);
  std::__cxx11::string::assign((char *)&this->datatype);
  std::__cxx11::string::assign((char *)&this->message_definition);
  this->has_header = false;
  return;
}

Assistant:

void init(const std::string& _topic, uint32_t _queue_size,
            const SubscriberStatusCallback& _connect_cb = SubscriberStatusCallback(),
            const SubscriberStatusCallback& _disconnect_cb = SubscriberStatusCallback())
  {
    topic = _topic;
    queue_size = _queue_size;
    connect_cb = _connect_cb;
    disconnect_cb = _disconnect_cb;
    md5sum = message_traits::md5sum<M>();
    datatype = message_traits::datatype<M>();
    message_definition = message_traits::definition<M>();
    has_header = message_traits::hasHeader<M>();
  }